

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  
  uVar8 = (long)end - (long)ptr;
  if ((long)uVar8 < 2) {
    return -1;
  }
  bVar1 = *ptr;
  iVar7 = 0;
  pcVar6 = ptr;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
LAB_00180c4c:
      iVar7 = 0;
      if (uVar8 < 4) {
        return -2;
      }
      goto LAB_00180c65;
    }
    if (bVar1 == 0) {
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      if (bVar2 < 0x16) {
        if (bVar2 == 6) {
          if (uVar8 == 2) {
            return -2;
          }
          goto LAB_00180c65;
        }
        if (bVar2 != 7) {
          if (bVar2 == 0x13) {
            pcVar6 = ptr + 2;
            if ((long)end - (long)pcVar6 < 2) {
              return -1;
            }
            if (*pcVar6 == '\0') {
              if ((ulong)(byte)ptr[3] == 0x78) {
                pcVar6 = ptr + 4;
                if ((long)end - (long)pcVar6 < 2) {
                  return -1;
                }
                if ((*pcVar6 == '\0') &&
                   ((*(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[5]) & 0xfe) == 0x18)) {
                  pcVar6 = ptr + 6;
                  lVar5 = (long)end - (long)pcVar6;
                  while( true ) {
                    if (lVar5 < 2) {
                      return -1;
                    }
                    if (*pcVar6 != '\0') goto LAB_00180c65;
                    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)pcVar6[1]);
                    if (1 < bVar1 - 0x18) break;
                    pcVar6 = pcVar6 + 2;
                    lVar5 = lVar5 + -2;
                  }
                  if (bVar1 == 0x12) {
                    iVar7 = 10;
                    pcVar6 = pcVar6 + 2;
                  }
                }
              }
              else if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]) == '\x19') {
                lVar5 = uVar8 - 4;
                pcVar4 = ptr + 4;
                do {
                  pcVar6 = pcVar4;
                  if (lVar5 < 2) {
                    return -1;
                  }
                  if (*pcVar6 != '\0') goto LAB_00180c65;
                  cVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar6[1]);
                  lVar5 = lVar5 + -2;
                  pcVar4 = pcVar6 + 2;
                } while (cVar3 == '\x19');
                if (cVar3 == '\x12') {
                  iVar7 = 10;
                  pcVar6 = pcVar6 + 2;
                }
              }
            }
          }
          goto LAB_00180c65;
        }
        goto LAB_00180c4c;
      }
      if ((bVar2 == 0x16) || (bVar2 == 0x18)) goto LAB_00180d1a;
      if (bVar2 != 0x1d) goto LAB_00180c65;
    }
  }
  else if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)ptr[1])))) goto LAB_00180c65;
  if ((*(uint *)((long)namingBitmap +
                (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
       ((byte)ptr[1] & 0x1f) & 1) != 0) {
LAB_00180d1a:
    uVar8 = uVar8 - 2;
    if ((long)uVar8 < 2) {
      return -1;
    }
    pcVar6 = ptr + 4;
LAB_00180d41:
    bVar1 = pcVar6[-2];
    if (0xdb < bVar1) {
      if (bVar1 == 0xff) {
        if ((byte)pcVar6[-1] < 0xfe) goto switchD_00180d74_caseD_1d;
      }
      else if (3 < bVar1 - 0xdc) goto switchD_00180d74_caseD_1d;
      goto switchD_00180d74_caseD_13;
    }
    if (bVar1 != 0) {
      if (bVar1 - 0xd8 < 4) {
LAB_00180e9c:
        if (uVar8 < 4) {
          return -2;
        }
      }
      else {
switchD_00180d74_caseD_1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)pcVar6[-1] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)pcVar6[-1] & 0x1f) & 1) != 0) goto switchD_00180d74_caseD_16;
      }
      goto switchD_00180d74_caseD_13;
    }
    cVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar6[-1]);
    switch(cVar3) {
    case '\x12':
      iVar7 = 9;
      break;
    case '\x16':
    case '\x18':
    case '\x19':
    case '\x1a':
    case '\x1b':
      goto switchD_00180d74_caseD_16;
    case '\x1d':
      goto switchD_00180d74_caseD_1d;
    default:
      if (cVar3 == '\x06') {
        if (uVar8 == 2) {
          return -2;
        }
      }
      else if (cVar3 == '\a') goto LAB_00180e9c;
    case '\x13':
    case '\x14':
    case '\x15':
    case '\x17':
    case '\x1c':
switchD_00180d74_caseD_13:
      pcVar6 = pcVar6 + -2;
    }
  }
LAB_00180c65:
  *nextTokPtr = pcVar6;
  return iVar7;
switchD_00180d74_caseD_16:
  uVar8 = uVar8 - 2;
  pcVar6 = pcVar6 + 2;
  if ((long)uVar8 < 2) {
    return -1;
  }
  goto LAB_00180d41;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}